

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindowSettings(ImGuiWindowSettings *settings)

{
  uint uVar1;
  char *pcVar2;
  ImGuiWindowSettings *in_RDI;
  bool in_stack_ffffffffffffffe7;
  
  if ((in_RDI->WantDelete & 1U) != 0) {
    BeginDisabled(in_stack_ffffffffffffffe7);
  }
  uVar1 = in_RDI->ID;
  pcVar2 = ImGuiWindowSettings::GetName(in_RDI);
  Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)uVar1,pcVar2,
       (ulong)(uint)(int)(in_RDI->Pos).x,(ulong)(uint)(int)(in_RDI->Pos).y,
       (ulong)(uint)(int)(in_RDI->Size).x,(int)(in_RDI->Size).y,(uint)(in_RDI->Collapsed & 1));
  if ((in_RDI->WantDelete & 1U) != 0) {
    EndDisabled();
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowSettings(ImGuiWindowSettings* settings)
{
    if (settings->WantDelete)
        BeginDisabled();
    Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",
        settings->ID, settings->GetName(), settings->Pos.x, settings->Pos.y, settings->Size.x, settings->Size.y, settings->Collapsed);
    if (settings->WantDelete)
        EndDisabled();
}